

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O3

wchar_t rd_player(void)

{
  ushort uVar1;
  short sVar2;
  int iVar3;
  char *pcVar4;
  equip_slot *peVar5;
  player *ppVar6;
  long lVar7;
  player_race **pppVar8;
  player_shape **pppVar9;
  player_class **pppVar10;
  ulong uVar11;
  uint8_t stat_max;
  uint8_t num;
  uint8_t tmp8u;
  char buf [80];
  byte local_7b;
  byte local_7a;
  byte local_79;
  char local_78 [88];
  
  local_7b = 0;
  rd_string(player->full_name,0x20);
  rd_string(player->died_from,0x50);
  pcVar4 = (char *)mem_zalloc(0xfa);
  player->history = pcVar4;
  rd_string(pcVar4,0xfa);
  rd_string(local_78,0x50);
  pppVar8 = &races;
  do {
    pppVar8 = &((player_race *)pppVar8)->next->next;
    if ((player_race *)pppVar8 == (player_race *)0x0) goto LAB_00161e35;
    iVar3 = strcmp(((player_race *)pppVar8)->name,local_78);
  } while (iVar3 != 0);
  player->race = (player_race *)pppVar8;
LAB_00161e35:
  if (player->race == (player_race *)0x0) {
    pcVar4 = "Invalid player race (%s).";
LAB_00162163:
    pcVar4 = format(pcVar4,local_78);
  }
  else {
    rd_string(local_78,0x50);
    pppVar9 = &shapes;
    do {
      pppVar9 = &((player_shape *)pppVar9)->next->next;
      if ((player_shape *)pppVar9 == (player_shape *)0x0) {
        if (player->shape != (player_shape *)0x0) goto LAB_00161e98;
        pcVar4 = "Invalid player shape (%s).";
        goto LAB_00162163;
      }
      iVar3 = strcmp(((player_shape *)pppVar9)->name,local_78);
    } while (iVar3 != 0);
    player->shape = (player_shape *)pppVar9;
LAB_00161e98:
    rd_string(local_78,0x50);
    pppVar10 = &classes;
    do {
      pppVar10 = &((player_class *)pppVar10)->next->next;
      if ((player_class *)pppVar10 == (player_class *)0x0) {
        ppVar6 = player;
        if (player->class != (player_class *)0x0) goto LAB_00161ee0;
        pcVar4 = "Invalid player class (%s).";
        goto LAB_00162163;
      }
      iVar3 = strcmp(((player_class *)pppVar10)->name,local_78);
      ppVar6 = player;
    } while (iVar3 != 0);
    player->class = (player_class *)pppVar10;
LAB_00161ee0:
    rd_byte(&(ppVar6->opts).name_suffix);
    rd_byte(&player->hitdie);
    rd_byte(&player->expfact);
    rd_s16b(&player->age);
    rd_s16b(&player->ht);
    rd_s16b(&player->wt);
    rd_byte(&local_7b);
    if (local_7b < 6) {
      if (local_7b != 0) {
        lVar7 = 0x4e;
        uVar11 = 0;
        do {
          rd_s16b((int16_t *)((long)player->stat_max + lVar7 + -0x4e));
          uVar11 = uVar11 + 1;
          lVar7 = lVar7 + 2;
        } while (uVar11 < local_7b);
        if (local_7b != 0) {
          lVar7 = 0x58;
          uVar11 = 0;
          do {
            rd_s16b((int16_t *)((long)player->stat_max + lVar7 + -0x4e));
            uVar11 = uVar11 + 1;
            lVar7 = lVar7 + 2;
          } while (uVar11 < local_7b);
          if (local_7b != 0) {
            lVar7 = 0x62;
            uVar11 = 0;
            do {
              rd_s16b((int16_t *)((long)player->stat_max + lVar7 + -0x4e));
              uVar11 = uVar11 + 1;
              lVar7 = lVar7 + 2;
            } while (uVar11 < local_7b);
            if (local_7b != 0) {
              lVar7 = 400;
              uVar11 = 0;
              do {
                rd_s16b((int16_t *)((long)player->stat_max + lVar7 + -0x4e));
                uVar11 = uVar11 + 1;
                lVar7 = lVar7 + 2;
              } while (uVar11 < local_7b);
            }
          }
        }
      }
      rd_s16b(&player->ht_birth);
      rd_s16b(&player->wt_birth);
      strip_bytes(2);
      rd_s32b(&player->au_birth);
      rd_string(local_78,0x50);
      pcVar4 = string_make(local_78);
      ppVar6 = player;
      (player->body).name = pcVar4;
      rd_u16b(&(ppVar6->body).count);
      uVar1 = (player->body).count;
      if (z_info->equip_slots_max < uVar1) {
        pcVar4 = "Too many (%u) body parts!";
      }
      else {
        peVar5 = (equip_slot *)mem_zalloc((ulong)uVar1 << 5);
        ppVar6 = player;
        (player->body).slots = peVar5;
        if ((ppVar6->body).count != 0) {
          lVar7 = 8;
          uVar11 = 0;
          do {
            rd_u16b((uint16_t *)((long)&((ppVar6->body).slots)->next + lVar7));
            rd_string(local_78,0x50);
            pcVar4 = string_make(local_78);
            *(char **)((long)&((player->body).slots)->type + lVar7) = pcVar4;
            uVar11 = uVar11 + 1;
            lVar7 = lVar7 + 0x20;
            ppVar6 = player;
          } while (uVar11 < (player->body).count);
        }
        strip_bytes(4);
        rd_s32b(&player->au);
        rd_s32b(&player->max_exp);
        rd_s32b(&player->exp);
        rd_u16b(&player->exp_frac);
        rd_s16b(&player->lev);
        if (0xffcd < (ushort)(player->lev - 0x33U)) {
          rd_s16b(&player->mhp);
          rd_s16b(&player->chp);
          rd_u16b(&player->chp_frac);
          rd_s16b(&player->msp);
          rd_s16b(&player->csp);
          rd_u16b(&player->csp_frac);
          rd_s16b(&player->max_lev);
          rd_s16b(&player->max_depth);
          rd_s16b(&player->recall_depth);
          ppVar6 = player;
          if (player->max_lev < player->lev) {
            player->max_lev = player->lev;
          }
          sVar2 = ppVar6->max_depth;
          if (sVar2 < 0) {
            ppVar6->max_depth = 1;
            sVar2 = 1;
          }
          if (ppVar6->recall_depth < 1) {
            ppVar6->recall_depth = sVar2;
          }
          if (-1 < ppVar6->chp) {
            my_strcpy(ppVar6->died_from,"(alive and well)",0x50);
          }
          rd_byte(&local_79);
          (player->old_grid).y = (uint)local_79;
          rd_byte(&local_79);
          (player->old_grid).x = (uint)local_79;
          strip_bytes(4);
          rd_byte(&player->skip_cmd_coercion);
          rd_byte(&player->unignoring);
          rd_s16b(&player->deep_descent);
          rd_s16b(&player->energy);
          rd_s16b(&player->word_recall);
          rd_byte(&local_7a);
          if (local_7a < 0x36) {
            if (local_7a == 0) {
              local_7a = 0;
            }
            else {
              lVar7 = 0;
              uVar11 = 0;
              do {
                rd_s16b((int16_t *)((long)player->timed + lVar7));
                uVar11 = uVar11 + 1;
                lVar7 = lVar7 + 2;
              } while (uVar11 < local_7a);
              if (0x34 < local_7a) goto LAB_0016234c;
            }
            memset((void *)((ulong)((uint)local_7a + (uint)local_7a) + (long)player->timed),0,
                   (ulong)(0x6a - (byte)(local_7a * '\x02')));
          }
          else {
            lVar7 = 0;
            do {
              rd_s16b((int16_t *)((long)player->timed + lVar7));
              lVar7 = lVar7 + 2;
            } while (lVar7 != 0x6a);
            strip_bytes((uint)local_7a * 2 + -0x6a);
            note("Discarded unsupported timed effects");
          }
LAB_0016234c:
          rd_u32b(&player->total_energy);
          rd_u32b(&player->resting_turn);
          strip_bytes(0x20);
          return L'\0';
        }
        pcVar4 = "Invalid player level (%d).";
      }
    }
    else {
      pcVar4 = "Too many stats (%d).";
    }
    pcVar4 = format(pcVar4);
  }
  note(pcVar4);
  return L'\xffffffff';
}

Assistant:

int rd_player(void)
{
	int i;
	uint8_t tmp8u, num;
	uint8_t stat_max = 0;
	char buf[80];
	struct player_race *r;
	struct player_shape *s;
	struct player_class *c;

	rd_string(player->full_name, sizeof(player->full_name));
	rd_string(player->died_from, 80);
	player->history = mem_zalloc(250);
	rd_string(player->history, 250);

	/* Player race */
	rd_string(buf, sizeof(buf));
	for (r = races; r; r = r->next) {
		if (streq(r->name, buf)) {
			player->race = r;
			break;
		}
	}

	/* Verify player race */
	if (!player->race) {
		note(format("Invalid player race (%s).", buf));
		return -1;
	}

	/* Player shape */
	rd_string(buf, sizeof(buf));
	for (s = shapes; s; s = s->next) {
		if (streq(s->name, buf)) {
			player->shape = s;
			break;
		}
	}

	/* If no player shape recorded, set to normal and hope for the best */
	if (!player->shape) {
		note(format("Invalid player shape (%s).", buf));
		return -1;
	}

	/* Player class */
	rd_string(buf, sizeof(buf));
	for (c = classes; c; c = c->next) {
		if (streq(c->name, buf)) {
			player->class = c;
			break;
		}
	}

	if (!player->class) {
		note(format("Invalid player class (%s).", buf));
		return -1;
	}

	/* Numeric name suffix */
	rd_byte(&player->opts.name_suffix);

	/* Special Race/Class info */
	rd_byte(&player->hitdie);
	rd_byte(&player->expfact);

	/* Age/Height/Weight */
	rd_s16b(&player->age);
	rd_s16b(&player->ht);
	rd_s16b(&player->wt);

	/* Read the stat info */
	rd_byte(&stat_max);
	if (stat_max > STAT_MAX) {
		note(format("Too many stats (%d).", stat_max));
		return -1;
	}

	for (i = 0; i < stat_max; i++) rd_s16b(&player->stat_max[i]);
	for (i = 0; i < stat_max; i++) rd_s16b(&player->stat_cur[i]);
	for (i = 0; i < stat_max; i++) rd_s16b(&player->stat_map[i]);
	for (i = 0; i < stat_max; i++) rd_s16b(&player->stat_birth[i]);

	rd_s16b(&player->ht_birth);
	rd_s16b(&player->wt_birth);
	strip_bytes(2);
	rd_s32b(&player->au_birth);

	/* Player body */
	rd_string(buf, sizeof(buf));
	player->body.name = string_make(buf);
	rd_u16b(&player->body.count);
	if (player->body.count > z_info->equip_slots_max) {
		note(format("Too many (%u) body parts!", player->body.count));
		return (-1);
	}

	player->body.slots = mem_zalloc(player->body.count *
									sizeof(struct equip_slot));
	for (i = 0; i < player->body.count; i++) {
		rd_u16b(&player->body.slots[i].type);
		rd_string(buf, sizeof(buf));
		player->body.slots[i].name = string_make(buf);
	}

	strip_bytes(4);

	rd_s32b(&player->au);

	rd_s32b(&player->max_exp);
	rd_s32b(&player->exp);
	rd_u16b(&player->exp_frac);

	rd_s16b(&player->lev);

	/* Verify player level */
	if ((player->lev < 1) || (player->lev > PY_MAX_LEVEL)) {
		note(format("Invalid player level (%d).", player->lev));
		return (-1);
	}

	rd_s16b(&player->mhp);
	rd_s16b(&player->chp);
	rd_u16b(&player->chp_frac);

	rd_s16b(&player->msp);
	rd_s16b(&player->csp);
	rd_u16b(&player->csp_frac);

	rd_s16b(&player->max_lev);
	rd_s16b(&player->max_depth);
	rd_s16b(&player->recall_depth);

	/* Hack -- Repair maximum player level */
	if (player->max_lev < player->lev) player->max_lev = player->lev;

	/* Hack -- Repair maximum dungeon level */
	if (player->max_depth < 0) player->max_depth = 1;
	if (player->recall_depth <= 0) player->recall_depth = player->max_depth;

	/* Hack -- Reset cause of death */
	if (player->chp >= 0)
		my_strcpy(player->died_from, "(alive and well)",
				  sizeof(player->died_from));

	/* More info */
	rd_byte(&tmp8u);
	player->old_grid.y = tmp8u;
	rd_byte(&tmp8u);
	player->old_grid.x = tmp8u;
	strip_bytes(4);
	rd_byte(&player->skip_cmd_coercion);
	rd_byte(&player->unignoring);
	rd_s16b(&player->deep_descent);

	/* Read the flags */
	rd_s16b(&player->energy);
	rd_s16b(&player->word_recall);

	/* Find the number of timed effects */
	rd_byte(&num);

	if (num <= TMD_MAX) {
		/* Read all the effects */
		for (i = 0; i < num; i++)
			rd_s16b(&player->timed[i]);

		/* Initialize any entries not read */
		if (num < TMD_MAX)
			memset(player->timed + num, 0, (TMD_MAX - num) * sizeof(int16_t));
	} else {
		/* Probably in trouble anyway */
		for (i = 0; i < TMD_MAX; i++)
			rd_s16b(&player->timed[i]);

		/* Discard unused entries */
		strip_bytes(2 * (num - TMD_MAX));
		note("Discarded unsupported timed effects");
	}

	/* Total energy used so far */
	rd_u32b(&player->total_energy);
	/* # of turns spent resting */
	rd_u32b(&player->resting_turn);

	/* Future use */
	strip_bytes(32);

	return 0;
}